

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

char * __thiscall
Fossilize::ConcurrentDatabase::get_db_path_for_hash
          (ConcurrentDatabase *this,ResourceTag tag,Hash hash)

{
  DatabaseInterface *pDVar1;
  pointer puVar2;
  int iVar3;
  undefined4 extraout_var;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *extra;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *puVar4;
  
  pDVar1 = (this->readonly_interface)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar1 != (DatabaseInterface *)0x0) {
    iVar3 = (*pDVar1->_vptr_DatabaseInterface[5])(pDVar1,tag,hash);
    if ((char)iVar3 != '\0') {
      puVar4 = &this->readonly_interface;
LAB_001748e0:
      pDVar1 = (puVar4->_M_t).
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      iVar3 = (*pDVar1->_vptr_DatabaseInterface[8])(pDVar1,tag,hash);
      return (char *)CONCAT44(extraout_var,iVar3);
    }
  }
  puVar4 = (this->extra_readonly).
           super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->extra_readonly).
           super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar4 == puVar2) {
      return (char *)0x0;
    }
    pDVar1 = (puVar4->_M_t).
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (pDVar1 != (DatabaseInterface *)0x0) {
      iVar3 = (*pDVar1->_vptr_DatabaseInterface[5])(pDVar1,tag,hash);
      if ((char)iVar3 != '\0') goto LAB_001748e0;
    }
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

const char *get_db_path_for_hash(ResourceTag tag, Hash hash) override
	{
		if (readonly_interface && readonly_interface->has_entry(tag, hash))
			return readonly_interface->get_db_path_for_hash(tag, hash);

		for (auto &extra : extra_readonly)
		{
			if (extra && extra->has_entry(tag, hash))
				return extra->get_db_path_for_hash(tag, hash);
		}

		return nullptr;
	}